

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined1 local_8428 [8];
  ElectricityBill bill;
  HttpServer server;
  EventLoop loop;
  InetAddress address;
  string log_path;
  allocator<char> local_31;
  
  address._32_8_ = &log_path._M_string_length;
  log_path._M_dataplus._M_p = (pointer)0x0;
  log_path._M_string_length._0_1_ = 0;
  bVar2 = false;
  bVar1 = false;
  while( true ) {
    while( true ) {
      iVar3 = getopt(argc,argv,"w:l:d");
      if (iVar3 != 0x77) break;
      std::__cxx11::string::assign((char *)&web_root_abi_cxx11_);
    }
    if (iVar3 == -1) break;
    if (iVar3 == 100) {
      bVar2 = true;
    }
    else if (iVar3 == 0x6c) {
      bVar1 = true;
      std::__cxx11::string::assign((char *)&address.port_);
    }
  }
  if (bVar2) {
    printf("daemon run");
    higan::System::DaemonRun();
  }
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8428,"df",
               (allocator<char> *)
               &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    higan::Logger::SetLogToFile((string *)&address.port_,(string *)local_8428,false);
    std::__cxx11::string::~string((string *)local_8428);
  }
  signal(0xd,(__sighandler_t)0x1);
  higan::EventLoop::EventLoop((EventLoop *)&server.on_http_request_._M_invoker);
  ElectricityBill::ElectricityBill
            ((ElectricityBill *)local_8428,(EventLoop *)&server.on_http_request_._M_invoker,
             &web_root_abi_cxx11_);
  g_bill = (ElectricityBill *)local_8428;
  higan::InetAddress::InetAddress((InetAddress *)&loop.timer_manager_.min_expire_time,4000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(log_path.field_2._M_local_buf + 8),"ElectricityBill",&local_31);
  higan::HttpServer::HttpServer
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (EventLoop *)&server.on_http_request_._M_invoker,
             (InetAddress *)&loop.timer_manager_.min_expire_time,
             (string *)((long)&log_path.field_2 + 8));
  std::__cxx11::string::~string((string *)(log_path.field_2._M_local_buf + 8));
  log_path.field_2._8_8_ = OnHttpRequest;
  higan::HttpServer::SetHttpRequestCallback
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (HttpCallback *)((long)&log_path.field_2 + 8));
  std::_Function_base::~_Function_base((_Function_base *)((long)&log_path.field_2 + 8));
  higan::HttpServer::Start
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  higan::EventLoop::Loop((EventLoop *)&server.on_http_request_._M_invoker);
  higan::HttpServer::~HttpServer
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&loop.timer_manager_.min_expire_time);
  ElectricityBill::~ElectricityBill((ElectricityBill *)local_8428);
  higan::EventLoop::~EventLoop((EventLoop *)&server.on_http_request_._M_invoker);
  std::__cxx11::string::~string((string *)&address.port_);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bool daemon = false;
	bool log_to_file = false;
	std::string log_path;

	int opt = -1;
	while ((opt = getopt(argc, argv, "w:l:d")) != -1)
	{
		switch (opt)
		{
			case 'w':
			{
				web_root = optarg;
				break;
			}
			case 'l':
			{
				log_to_file = true;
				log_path = optarg;
				break;
			}
			case 'd':
			{
				daemon = true;
				break;
			}
			default:
				break;
		}
	}

	if (daemon)
	{
		printf("daemon run");
		higan::System::DaemonRun();
	}
	if (log_to_file)
	{
		higan::Logger::SetLogToFile(log_path, "df", false);
	}

	signal(SIGPIPE, SIG_IGN);

	higan::EventLoop loop;

	ElectricityBill bill(&loop, web_root);
	g_bill = &bill;

	higan::InetAddress address{4000};

	higan::HttpServer server{&loop, address, "ElectricityBill"};
	server.SetHttpRequestCallback(OnHttpRequest);

	server.Start();
	loop.Loop();

	return 0;
}